

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O3

void __thiscall
siamese::EncoderPacketWindow::RemoveBefore(EncoderPacketWindow *this,uint firstKeptColumn)

{
  ostringstream *poVar1;
  OutputWorker *pOVar2;
  uint uVar3;
  undefined1 local_1a8 [392];
  
  if (this->EmergencyDisabled == false) {
    uVar3 = firstKeptColumn - this->ColumnStart & 0x3fffff;
    if (uVar3 < this->Count) {
      if (DAT_001b9078 < 3) {
        poVar1 = (ostringstream *)(local_1a8 + 0x10);
        local_1a8._0_8_ = Logger;
        local_1a8._8_4_ = Info;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,DAT_001b90a8,DAT_001b90b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Remove before column ",0x15);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," element ",9);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        pOVar2 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_1a8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
      }
      if (this->FirstUnremovedElement < uVar3) {
        this->FirstUnremovedElement = uVar3;
      }
    }
    else {
      if (uVar3 < 0x200000) {
        this->Count = 0;
        if (2 < DAT_001b9078) {
          return;
        }
        poVar1 = (ostringstream *)(local_1a8 + 0x10);
        local_1a8._0_8_ = Logger;
        local_1a8._8_4_ = Info;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,DAT_001b90a8,DAT_001b90b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Remove before column ",0x15);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," - Removed everything",0x15);
        pOVar2 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_1a8);
      }
      else {
        if (2 < DAT_001b9078) {
          return;
        }
        poVar1 = (ostringstream *)(local_1a8 + 0x10);
        local_1a8._0_8_ = Logger;
        local_1a8._8_4_ = Info;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,DAT_001b90a8,DAT_001b90b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Remove before column ",0x15);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," - Ignored before window",0x18);
        pOVar2 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_1a8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 0x10));
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
  }
  return;
}

Assistant:

void EncoderPacketWindow::RemoveBefore(unsigned firstKeptColumn)
{
    if (EmergencyDisabled) {
        return;
    }

    // Convert column to element, handling wrap-around:
    const unsigned firstKeptElement = ColumnToElement(firstKeptColumn);

    // If the column is outside of the window:
    if (InvalidElement(firstKeptElement))
    {
        // If the element was before the window:
        if (IsColumnDeltaNegative(firstKeptElement)) {
            Logger.Info("Remove before column ", firstKeptColumn, " - Ignored before window");
        }
        else
        {
            // Removed everything
            Count = 0;

            Logger.Info("Remove before column ", firstKeptColumn, " - Removed everything");
        }
    }
    else
    {
        Logger.Info("Remove before column ", firstKeptColumn, " element ", firstKeptElement);

        // Mark these elements for removal next time we generate output
        if (FirstUnremovedElement < firstKeptElement) {
            FirstUnremovedElement = firstKeptElement;
        }
    }
}